

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

int as154_seas(double *inp,int N,int optmethod,int p,int d,int q,int s,int P,int D,int Q,double *phi
              ,double *theta,double *PHI,double *THETA,double *wmean,double *var,double *loglik,
              double *hess,int cssml)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *oup;
  double *oup_00;
  double *pdVar5;
  double *pdVar6;
  alik_seas_object object;
  double *col;
  double *dx_00;
  int *ipiv_00;
  undefined1 local_f8 [8];
  custom_function as154_min;
  reg_object fit;
  alik_seas_object obj;
  double sigma;
  double coeff;
  double maxstep;
  int *ipiv;
  double *varcovar;
  double *res;
  double *thess;
  double *dx;
  double *inp2;
  double *x;
  double *tf;
  double *b;
  int ERR;
  int rp;
  int nd;
  int ret;
  int offset;
  int length;
  int retval;
  int pq;
  int i;
  int q_local;
  int d_local;
  int p_local;
  int optmethod_local;
  int N_local;
  double *inp_local;
  
  pq = q;
  i = d;
  q_local = p;
  d_local = optmethod;
  p_local = N;
  _optmethod_local = inp;
  oup = (double *)malloc((long)(N - s * D) << 3);
  iVar2 = p_local;
  sigma = 0.0;
  if (cssml == 1) {
    css_seas(_optmethod_local,p_local,d_local,q_local,i,pq,s,P,D,Q,phi,theta,PHI,THETA,wmean,var,
             loglik,hess);
    iVar3 = checkroots_cerr(phi,&q_local,theta,&pq,PHI,&P,THETA,&Q);
    if (iVar3 == 10) {
      return 10;
    }
    if (iVar3 == 0xc) {
      return 0xc;
    }
    sigma = *wmean;
  }
  else {
    for (retval = 0; retval < q_local; retval = retval + 1) {
      phi[retval] = 0.0;
    }
    for (retval = 0; retval < pq; retval = retval + 1) {
      theta[retval] = 0.0;
    }
    for (retval = 0; retval < P; retval = retval + 1) {
      PHI[retval] = 0.0;
    }
    for (retval = 0; retval < Q; retval = retval + 1) {
      THETA[retval] = 0.0;
    }
  }
  iVar3 = i + D;
  if (D < 1) {
    for (retval = 0; retval < p_local; retval = retval + 1) {
      oup[retval] = _optmethod_local[retval];
    }
  }
  else {
    p_local = diffs(_optmethod_local,p_local,D,s,oup);
  }
  if ((((q_local + pq + P + Q == 0) && (i == 0)) && (D == 0)) && (cssml == 1)) {
    free(oup);
    inp_local._4_4_ = 1;
  }
  else {
    oup_00 = (double *)malloc((long)(p_local - i) << 3);
    if (i < 1) {
      for (retval = 0; retval < p_local; retval = retval + 1) {
        oup_00[retval] = oup[retval];
      }
    }
    else {
      p_local = diff(oup,p_local,i,oup_00);
    }
    if (iVar3 == 0) {
      pdVar5 = (double *)malloc(8);
      pdVar6 = (double *)malloc((long)p_local << 3);
      as154_min.params = reg_init(p_local,1);
      setIntercept((reg_object)as154_min.params,1);
      regress((reg_object)as154_min.params,(double *)0x0,oup_00,pdVar6,pdVar5,0.95);
      sigma = *(double *)((long)as154_min.params + 0xb0);
      free(pdVar5);
      free(pdVar6);
      free_reg((reg_object)as154_min.params);
    }
    object = alik_seas_init(q_local,i,pq,s,P,D,Q,p_local);
    iVar3 = object->pq;
    pdVar5 = (double *)malloc((long)iVar3 << 3);
    pdVar6 = (double *)malloc((long)iVar3 << 3);
    col = (double *)malloc((long)iVar3 * 8 * (long)iVar3);
    dx_00 = (double *)malloc((long)iVar3 << 3);
    ipiv_00 = (int *)malloc((long)iVar3 << 2);
    object->N = p_local;
    iVar4 = object->offset;
    for (retval = 0; retval < q_local; retval = retval + 1) {
      pdVar5[retval] = phi[retval];
    }
    for (retval = 0; retval < pq; retval = retval + 1) {
      pdVar5[q_local + retval] = -theta[retval];
    }
    for (retval = 0; retval < P; retval = retval + 1) {
      pdVar5[q_local + pq + retval] = PHI[retval];
    }
    for (retval = 0; retval < Q; retval = retval + 1) {
      pdVar5[q_local + pq + P + retval] = -THETA[retval];
    }
    if (object->M == 1) {
      pdVar5[q_local + pq + P + Q] = sigma;
    }
    object->mean = sigma;
    for (retval = 0; retval < p_local; retval = retval + 1) {
      dVar1 = oup_00[retval];
      object->x[iVar4 + p_local * 2 + retval] = dVar1;
      object->x[iVar4 + retval] = dVar1;
    }
    for (retval = p_local; SBORROW4(retval,p_local * 2) != retval + p_local * -2 < 0;
        retval = retval + 1) {
      object->x[iVar4 + retval] = 0.0;
    }
    local_f8 = (undefined1  [8])fas154_seas;
    as154_min.funcpt = (_func_double_double_ptr_int_void_ptr *)object;
    iVar4 = fminunc((custom_function *)local_f8,(custom_gradient *)0x0,iVar3,pdVar5,1.0,d_local,
                    pdVar6);
    if (iVar4 == 0) {
      rp = 0;
    }
    else if (iVar4 == 0xf) {
      rp = 0xf;
    }
    else if (iVar4 == 4) {
      rp = 4;
    }
    else {
      rp = 1;
    }
    for (retval = 0; retval < iVar3; retval = retval + 1) {
      dx_00[retval] = 1.0;
    }
    if (0 < pq) {
      invertroot(pq,pdVar6 + q_local);
    }
    if (0 < Q) {
      invertroot(Q,pdVar6 + (long)q_local + (long)pq + (long)P);
    }
    hessian_fd((custom_function *)local_f8,pdVar6,iVar3,dx_00,object->eps,hess);
    mtranspose(hess,iVar3,iVar3,col);
    for (retval = 0; retval < iVar3 * iVar3; retval = retval + 1) {
      col[retval] = (double)((iVar2 - i) - s * D) * 0.5 * (hess[retval] + col[retval]);
    }
    ludecomp(col,iVar3,ipiv_00);
    minverse(col,iVar3,ipiv_00,hess);
    for (retval = 0; retval < q_local; retval = retval + 1) {
      phi[retval] = pdVar6[retval];
    }
    for (retval = 0; retval < pq; retval = retval + 1) {
      theta[retval] = -pdVar6[q_local + retval];
    }
    for (retval = 0; retval < P; retval = retval + 1) {
      PHI[retval] = pdVar6[q_local + pq + retval];
    }
    for (retval = 0; retval < Q; retval = retval + 1) {
      THETA[retval] = -pdVar6[q_local + pq + P + retval];
    }
    if (object->M == 1) {
      *wmean = pdVar6[q_local + pq + Q + P];
    }
    else {
      *wmean = 0.0;
    }
    *var = object->ssq / (double)p_local;
    *loglik = object->loglik;
    free(pdVar5);
    free(pdVar6);
    free(oup);
    free(oup_00);
    free(dx_00);
    free(col);
    free(ipiv_00);
    free_alik_seas(object);
    inp_local._4_4_ = rp;
  }
  return inp_local._4_4_;
}

Assistant:

int as154_seas(double *inp, int N, int optmethod, int p, int d, int q, int s, int P, int D, int Q,double *phi, double *theta, 
	double *PHI, double *THETA, double *wmean,double *var,double *loglik,double *hess,int cssml) {
	int i, pq, retval, length, offset,ret,nd,rp,ERR;
	double *b, *tf, *x,*inp2,*dx,*thess,*res,*varcovar;
	int *ipiv;
	double maxstep,coeff,sigma;
	alik_seas_object obj;
	reg_object fit;
	//custom_function as154_min;
	
	inp2 = (double*)malloc(sizeof(double)* (N - s*D));
	

	length = N;

	maxstep = 1.0;
	coeff = 0.0;
	sigma = 1.0;

	if (cssml == 1) {
		css_seas(inp, N, optmethod, p, d, q, s, P, D, Q, phi, theta, PHI, THETA, wmean, var, loglik, hess);

		ERR = checkroots_cerr(phi, &p, theta, &q, PHI, &P, THETA, &Q);
		if (ERR == 10 || ERR == 12) return ERR;

		coeff = *wmean;
	}
	else {
		for (i = 0; i < p; ++i) phi[i] = 0.0;
		for (i = 0; i < q; ++i) theta[i] = 0.0;
		for (i = 0; i < P; ++i) PHI[i] = 0.0;
		for (i = 0; i < Q; ++i) THETA[i] = 0.0;
	}


	/*

	*/

	nd = d + D;

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	if (p + q + P + Q == 0 && d == 0 && D == 0 && cssml == 1) {
		free(inp2);
		return 1;
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	if (nd == 0) {
		rp = 1;
		varcovar = (double*)malloc(sizeof(double) * rp * rp);
		res = (double*)malloc(sizeof(double) * N);

		fit = reg_init(N, rp);

		setIntercept(fit, 1);
		regress(fit, NULL, x, res, varcovar, 0.95);

		
		coeff = (fit->beta + 0)->value;
		sigma = 10.0 * (fit->beta + 0)->stdErr;


		free(varcovar);
		free(res);
		free_reg(fit);
	}

	obj = alik_seas_init(p, d, q, s, P, D, Q, N);
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	obj->N = N;

	offset = obj->offset;
	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = PHI[i];
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = -THETA[i];
	}

	if (obj->M == 1) {
		b[p + q + P + Q] = coeff;
	}

	obj->mean = coeff;

	//mdisplay(b, 1, p + q + P + Q);

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}
	//printf("\n %d %g ", pq,maxstep);

	custom_function as154_min = { fas154_seas, obj };
	retval = fminunc(&as154_min, NULL, pq, b, maxstep, optmethod, tf);
	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	//Check for invertibility

	if (q > 0) {
		invertroot(q,tf+p);
	}

	if (Q > 0) {
		invertroot(Q,tf+p+q+P);
	}

	//if (obj->M == 1) dx[pq - 1] = sigma;

	hessian_fd(&as154_min, tf, pq, dx, obj->eps, hess);

	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (length - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}

	//mdisplay(thess,pq,pq);

	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	//mdisplay(hess,pq,pq);


	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}

	if (obj->M == 1) {
		*wmean = tf[p + q + Q + P];
	}
	else {
		*wmean = 0.0;
	}

	*var = (obj->ssq) / (double) N;
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(inp2);
	free(x);
	free(dx);
	free(thess);
	free(ipiv);
	free_alik_seas(obj);
	return ret;
}